

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::ComputeBuildFileGenerators(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  uint uVar3;
  ulong uVar4;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> gens;
  _Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> local_40
  ;
  
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)((long)(this->LocalGenerators).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->LocalGenerators).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    cmMakefile::GetExportBuildFileGenerators
              ((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                *)&local_40,
               (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar4]);
    ppcVar1 = local_40._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar2 = local_40._M_impl.super__Vector_impl_data._M_start; ppcVar2 != ppcVar1;
        ppcVar2 = ppcVar2 + 1) {
      cmExportBuildFileGenerator::Compute
                (*ppcVar2,(this->LocalGenerators).
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    }
    std::_Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
    ~_Vector_base(&local_40);
  }
  return;
}

Assistant:

void cmGlobalGenerator::ComputeBuildFileGenerators()
{
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmExportBuildFileGenerator*> gens =
      this->Makefiles[i]->GetExportBuildFileGenerators();
    for (cmExportBuildFileGenerator* g : gens) {
      g->Compute(this->LocalGenerators[i]);
    }
  }
}